

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

Triple * __thiscall
llvm::Triple::getBigEndianArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  ArchType AVar1;
  pointer pcVar2;
  ObjectFormatType OVar3;
  SubArchType SVar4;
  VendorType VVar5;
  OSType OVar6;
  size_t sVar7;
  char *pcVar8;
  StringRef Str;
  
  (__return_storage_ptr__->Data)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Data).field_2
  ;
  pcVar2 = (this->Data)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->Data)._M_string_length);
  OVar3 = this->ObjectFormat;
  __return_storage_ptr__->Environment = this->Environment;
  __return_storage_ptr__->ObjectFormat = OVar3;
  SVar4 = this->SubArch;
  VVar5 = this->Vendor;
  OVar6 = this->OS;
  __return_storage_ptr__->Arch = this->Arch;
  __return_storage_ptr__->SubArch = SVar4;
  __return_storage_ptr__->Vendor = VVar5;
  __return_storage_ptr__->OS = OVar6;
  AVar1 = this->Arch;
  if (0x32 < (ulong)AVar1) {
    return __return_storage_ptr__;
  }
  if ((0x7bfffb27ceacaU >> ((ulong)AVar1 & 0x3f) & 1) == 0) {
    return __return_storage_ptr__;
  }
  switch(AVar1) {
  case UnknownArch:
  case arm:
  case avr:
  case hexagon:
  case msp430:
  case nios2:
  case r600:
  case amdgcn:
  case riscv32:
  case riscv64:
  case thumb:
  case x86:
  case x86_64:
  case xcore:
  case nvptx:
  case nvptx64:
  case le32:
  case le64:
  case amdil:
  case amdil64:
  case hsail:
  case hsail64:
  case spir:
  case spir64:
  case kalimba:
  case shave:
  case wasm32:
  case wasm64:
  case renderscript32:
  case LastArchType:
    pcVar8 = "unknown";
    sVar7 = 7;
    break;
  default:
    llvm_unreachable_internal
              ("getBigEndianArchVariant: unknown triple.",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0x59b);
  case aarch64:
    pcVar8 = "aarch64_be";
    sVar7 = 10;
    break;
  case bpfel:
    pcVar8 = "bpfeb";
    goto LAB_0018cd49;
  case mipsel:
    pcVar8 = "mips";
    sVar7 = 4;
    break;
  case mips64el:
    pcVar8 = "mips64";
    sVar7 = 6;
    break;
  case ppc64le:
    pcVar8 = "powerpc64";
    sVar7 = 9;
    break;
  case sparcel:
    pcVar8 = "sparc";
LAB_0018cd49:
    sVar7 = 5;
    break;
  case tcele:
    pcVar8 = "tce";
    sVar7 = 3;
  }
  Str.Length = sVar7;
  Str.Data = pcVar8;
  setArchName(__return_storage_ptr__,Str);
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::getBigEndianArchVariant() const {
  Triple T(*this);
  // Already big endian.
  if (!isLittleEndian())
    return T;
  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::amdgcn:
  case Triple::amdil64:
  case Triple::amdil:
  case Triple::avr:
  case Triple::hexagon:
  case Triple::hsail64:
  case Triple::hsail:
  case Triple::kalimba:
  case Triple::le32:
  case Triple::le64:
  case Triple::msp430:
  case Triple::nios2:
  case Triple::nvptx64:
  case Triple::nvptx:
  case Triple::r600:
  case Triple::riscv32:
  case Triple::riscv64:
  case Triple::shave:
  case Triple::spir64:
  case Triple::spir:
  case Triple::wasm32:
  case Triple::wasm64:
  case Triple::x86:
  case Triple::x86_64:
  case Triple::xcore:
  case Triple::renderscript32:
  case Triple::renderscript64:

  // ARM is intentionally unsupported here, changing the architecture would
  // drop any arch suffixes.
  case Triple::arm:
  case Triple::thumb:
    T.setArch(UnknownArch);
    break;

  case Triple::tcele:   T.setArch(Triple::tce);        break;
  case Triple::aarch64: T.setArch(Triple::aarch64_be); break;
  case Triple::bpfel:   T.setArch(Triple::bpfeb);      break;
  case Triple::mips64el:T.setArch(Triple::mips64);     break;
  case Triple::mipsel:  T.setArch(Triple::mips);       break;
  case Triple::ppc64le: T.setArch(Triple::ppc64);      break;
  case Triple::sparcel: T.setArch(Triple::sparc);      break;
  default:
    llvm_unreachable("getBigEndianArchVariant: unknown triple.");
  }
  return T;
}